

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SetWindowConditionAllowFlags(ImGuiWindow *window,ImGuiCond flags,bool enabled)

{
  ulong uVar1;
  uint uVar2;
  undefined3 in_register_00000011;
  uint uVar3;
  ulong uVar4;
  
  if (CONCAT31(in_register_00000011,enabled) == 0) {
    uVar3 = ~flags;
    uVar2 = window->SetWindowPosAllowFlags & uVar3;
    uVar1._0_4_ = window->SetWindowSizeAllowFlags;
    uVar1._4_4_ = window->SetWindowCollapsedAllowFlags;
    uVar4 = CONCAT44(uVar3,uVar3) & uVar1;
    uVar3 = uVar3 & window->SetWindowDockAllowFlags;
  }
  else {
    uVar2 = window->SetWindowPosAllowFlags | flags;
    uVar4._0_4_ = window->SetWindowSizeAllowFlags;
    uVar4._4_4_ = window->SetWindowCollapsedAllowFlags;
    uVar4 = CONCAT44(flags,flags) | uVar4;
    uVar3 = flags | window->SetWindowDockAllowFlags;
  }
  window->SetWindowPosAllowFlags = uVar2;
  window->SetWindowSizeAllowFlags = (int)uVar4;
  window->SetWindowCollapsedAllowFlags = (int)(uVar4 >> 0x20);
  window->SetWindowDockAllowFlags = uVar3;
  return;
}

Assistant:

static void SetWindowConditionAllowFlags(ImGuiWindow* window, ImGuiCond flags, bool enabled)
{
    window->SetWindowPosAllowFlags       = enabled ? (window->SetWindowPosAllowFlags       | flags) : (window->SetWindowPosAllowFlags       & ~flags);
    window->SetWindowSizeAllowFlags      = enabled ? (window->SetWindowSizeAllowFlags      | flags) : (window->SetWindowSizeAllowFlags      & ~flags);
    window->SetWindowCollapsedAllowFlags = enabled ? (window->SetWindowCollapsedAllowFlags | flags) : (window->SetWindowCollapsedAllowFlags & ~flags);
    window->SetWindowDockAllowFlags      = enabled ? (window->SetWindowDockAllowFlags      | flags) : (window->SetWindowDockAllowFlags      & ~flags);
}